

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

char * getcontent(xmlNode *attr)

{
  size_t sVar1;
  char *pcVar2;
  ushort **ppuVar3;
  long in_RDI;
  bool bVar4;
  size_t len;
  char *sp;
  char *p;
  char *content;
  size_t size;
  xmlNode *chain;
  char *local_30;
  char *local_28;
  long local_18;
  long local_10;
  
  local_10 = *(long *)(in_RDI + 0x18);
  local_18 = 0;
  for (; local_10 != 0; local_10 = *(long *)(local_10 + 0x30)) {
    if (*(int *)(local_10 + 8) == 3) {
      sVar1 = strlen(*(char **)(local_10 + 0x50));
      local_18 = sVar1 + local_18;
    }
  }
  pcVar2 = (char *)malloc(local_18 + 1);
  local_28 = pcVar2;
  for (local_10 = *(long *)(in_RDI + 0x18); local_10 != 0; local_10 = *(long *)(local_10 + 0x30)) {
    if (*(int *)(local_10 + 8) == 3) {
      local_30 = *(char **)(local_10 + 0x50);
      if (local_28 == pcVar2) {
        while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*local_30] & 0x2000) != 0) {
          local_30 = local_30 + 1;
        }
      }
      sVar1 = strlen(local_30);
      memcpy(local_28,local_30,sVar1);
      local_28 = local_28 + sVar1;
    }
  }
  while( true ) {
    bVar4 = false;
    if (local_28 != pcVar2) {
      ppuVar3 = __ctype_b_loc();
      bVar4 = ((*ppuVar3)[(int)local_28[-1]] & 0x2000) != 0;
    }
    if (!bVar4) break;
    local_28 = local_28 + -1;
  }
  *local_28 = '\0';
  return pcVar2;
}

Assistant:

static char *getcontent (xmlNode *attr) {
	xmlNode *chain = attr->children;
	size_t size = 0;
	char *content, *p;
	while (chain) {
		if (chain->type == XML_TEXT_NODE)
			size += strlen(chain->content);
		chain = chain->next;
	}
	p = content = malloc(size + 1);
	chain = attr->children;
	while (chain) {
		if (chain->type == XML_TEXT_NODE) {
			char* sp = chain->content;
			if(p == content) {
				while(isspace(*sp))
					++sp;
			}
			size_t len = strlen(sp);
			memcpy(p, sp, len);
			p += len;
		}
		chain = chain->next;
	}
	while(p != content && isspace(p[-1]))
		--p;
	*p = 0;
	return content;
}